

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_constants_melee_critical_level(parser *p)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  parser_error pVar4;
  void *pvVar5;
  char *name;
  undefined8 *puVar6;
  undefined8 *puVar7;
  
  pvVar5 = parser_priv(p);
  uVar2 = parser_getuint(p,"chance");
  name = parser_getstr(p,"msg");
  iVar3 = message_lookup_by_name(name);
  if (uVar2 == 0) {
    pVar4 = PARSE_ERROR_INVALID_VALUE;
  }
  else if (iVar3 < 0) {
    pVar4 = PARSE_ERROR_INVALID_MESSAGE;
  }
  else {
    puVar6 = (undefined8 *)mem_alloc(0x18);
    *puVar6 = 0;
    *(uint *)(puVar6 + 1) = uVar2;
    uVar2 = parser_getuint(p,"dice");
    *(uint *)((long)puVar6 + 0xc) = uVar2;
    *(int *)(puVar6 + 2) = iVar3;
    puVar1 = *(undefined8 **)((long)pvVar5 + 0xc0);
    if (*(undefined8 **)((long)pvVar5 + 0xc0) == (undefined8 *)0x0) {
      puVar7 = (undefined8 *)((long)pvVar5 + 0xc0);
    }
    else {
      do {
        puVar7 = puVar1;
        puVar1 = (undefined8 *)*puVar7;
      } while ((undefined8 *)*puVar7 != (undefined8 *)0x0);
    }
    *puVar7 = puVar6;
    pVar4 = PARSE_ERROR_NONE;
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_constants_melee_critical_level(struct parser *p)
{
	struct angband_constants *z = parser_priv(p);
	struct critical_level *new_level;
	unsigned int chance = parser_getuint(p, "chance");
	const char *msgt_str = parser_getstr(p, "msg");
	int msgt = message_lookup_by_name(msgt_str);

	if (chance == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	if (msgt < 0) {
		return PARSE_ERROR_INVALID_MESSAGE;
	}
	new_level = mem_alloc(sizeof(*new_level));
	new_level->next = NULL;
	new_level->chance = chance;
	new_level->added_dice = parser_getuint(p, "dice");
	new_level->msgt = msgt;
	/* Add it to the end of the linked list. */
	if (z->m_crit_level_head) {
		struct critical_level *cursor = z->m_crit_level_head;

		while (cursor->next) {
			cursor = cursor->next;
		}
		cursor->next = new_level;
	} else {
		z->m_crit_level_head = new_level;
	}

	return PARSE_ERROR_NONE;
}